

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O0

void __thiscall CCamCal::outTxt(CCamCal *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  char *__filename;
  FILE *__stream;
  double *pdVar10;
  undefined1 local_e8 [8];
  Mat oCalDistCoeffMat;
  Mat oCalIntMat;
  FILE *pfHomoMat;
  CCamCal *this_local;
  
  __filename = CCfg::getOutCamMatPth(&this->m_oCfg);
  __stream = fopen(__filename,"w");
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,0);
  dVar1 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,1);
  dVar2 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,2);
  dVar3 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,0);
  dVar4 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,1);
  dVar5 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,2);
  dVar6 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,2,0);
  dVar7 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,2,1);
  dVar8 = *pdVar10;
  cv::Mat::at<double>(&this->m_oHomoMat,2,2);
  fprintf(__stream,
          "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
          dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,0);
  dVar1 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,1);
  dVar2 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,0,2);
  dVar3 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,0);
  dVar4 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,1);
  dVar5 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,1,2);
  dVar6 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,2,0);
  dVar7 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(&this->m_oHomoMat,2,1);
  dVar8 = *pdVar10;
  cv::Mat::at<double>(&this->m_oHomoMat,2,2);
  printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",dVar1
         ,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
  bVar9 = CCfg::getCalDistFlg(&this->m_oCfg);
  if (bVar9) {
    CCfg::getCalIntMat((CCfg *)&stack0xffffffffffffff88);
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,0);
    dVar1 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,1);
    dVar2 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,2);
    dVar3 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,0);
    dVar4 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,1);
    dVar5 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,2);
    dVar6 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,0);
    dVar7 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,1);
    dVar8 = *pdVar10;
    cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,2);
    fprintf(__stream,
            "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
            ,dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,0);
    dVar1 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,1);
    dVar2 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,0,2);
    dVar3 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,0);
    dVar4 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,1);
    dVar5 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,1,2);
    dVar6 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,0);
    dVar7 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,1);
    dVar8 = *pdVar10;
    cv::Mat::at<double>((Mat *)&stack0xffffffffffffff88,2,2);
    printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
           ,dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
    CCfg::getCalDistCoeffMat((CCfg *)local_e8);
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,0);
    dVar1 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,1);
    dVar2 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,2);
    dVar3 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,3);
    fprintf(__stream,"Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",dVar1,dVar2,dVar3,
            *pdVar10);
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,0);
    dVar1 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,1);
    dVar2 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,2);
    dVar3 = *pdVar10;
    pdVar10 = cv::Mat::at<double>((Mat *)local_e8,3);
    printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",dVar1,dVar2,dVar3,*pdVar10);
    cv::Mat::~Mat((Mat *)local_e8);
    cv::Mat::~Mat((Mat *)&stack0xffffffffffffff88);
  }
  fprintf(__stream,"Reprojection error: %.15lf\n",this->m_fReprojErr);
  printf("Reprojection error: %.15lf\n",this->m_fReprojErr);
  fclose(__stream);
  return;
}

Assistant:

void CCamCal::outTxt(void)
{
	FILE* pfHomoMat = std::fopen(m_oCfg.getOutCamMatPth(), "w");

	std::fprintf(pfHomoMat, "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));
	std::printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));

	if (m_oCfg.getCalDistFlg())
	{
	    cv::Mat oCalIntMat = m_oCfg.getCalIntMat();
	    std::fprintf(pfHomoMat, "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));
	    std::printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));

		cv::Mat oCalDistCoeffMat = m_oCfg.getCalDistCoeffMat();
		std::fprintf(pfHomoMat, "Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
		std::printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
	}

	std::fprintf(pfHomoMat, "Reprojection error: %.15lf\n", m_fReprojErr);
	std::printf("Reprojection error: %.15lf\n", m_fReprojErr);

	std::fclose(pfHomoMat);
}